

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

substring __thiscall TC_parser<false>::read_name(TC_parser<false> *this)

{
  char *pcVar1;
  substring sVar2;
  bool bVar3;
  TC_parser<false> *this_local;
  substring ret;
  
  pcVar1 = this->reading_head;
  while( true ) {
    bVar3 = true;
    if ((((*this->reading_head != ' ') && (bVar3 = true, *this->reading_head != ':')) &&
        (bVar3 = true, *this->reading_head != '\t')) &&
       ((bVar3 = true, *this->reading_head != '|' &&
        (bVar3 = true, this->reading_head != this->endLine)))) {
      bVar3 = *this->reading_head == '\r';
    }
    if (bVar3) break;
    this->reading_head = this->reading_head + 1;
  }
  sVar2.end = this->reading_head;
  sVar2.begin = pcVar1;
  return sVar2;
}

Assistant:

inline substring read_name()
  {
    substring ret;
    ret.begin = reading_head;
    while (!(*reading_head == ' ' || *reading_head == ':' || *reading_head == '\t' || *reading_head == '|' ||
        reading_head == endLine || *reading_head == '\r'))
      ++reading_head;
    ret.end = reading_head;

    return ret;
  }